

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int al_get_new_bitmap_flags(void)

{
  thread_local_state *ptVar1;
  thread_local_state *tls;
  int local_4;
  
  ptVar1 = tls_get();
  if (ptVar1 == (thread_local_state *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = ptVar1->new_bitmap_flags;
  }
  return local_4;
}

Assistant:

int al_get_new_bitmap_flags(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return 0;
   return tls->new_bitmap_flags;
}